

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenReceiver(GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(&local_30,&this->namer_,struct_def);
  std::operator+(&local_70,"func (rcv *",&local_30);
  std::operator+(&local_50,&local_70,")");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void GenReceiver(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "func (rcv *" + namer_.Type(struct_def) + ")";
  }